

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTP_Server.cpp
# Opt level: O2

bool __thiscall Jupiter::HTTP::Server::Data::has(Data *this,string_view hostname)

{
  pointer puVar1;
  Host *pHVar2;
  bool bVar3;
  uint uVar4;
  char *in_RCX;
  unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_> *host;
  pointer puVar5;
  basic_string_view<char,_std::char_traits<char>_> rhs;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  
  local_28._M_str = hostname._M_str;
  local_28._M_len = hostname._M_len;
  uVar4 = calc_checksumi<unsigned_int,std::basic_string_view<char,std::char_traits<char>>>
                    (&local_28);
  puVar1 = (this->m_hosts).
           super__Vector_base<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar5 = (this->m_hosts).
                super__Vector_base<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar5 != puVar1; puVar5 = puVar5 + 1) {
    pHVar2 = (puVar5->_M_t).
             super___uniq_ptr_impl<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>
             ._M_t.
             super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Host_*,_std::default_delete<Jupiter::HTTP::Server::Host>_>
             .super__Head_base<0UL,_Jupiter::HTTP::Server::Host_*,_false>._M_head_impl;
    if (uVar4 == (pHVar2->super_Directory).name_checksum) {
      rhs._M_str = in_RCX;
      rhs._M_len = (size_t)local_28._M_str;
      bVar3 = jessilib::equalsi<char,char>
                        ((jessilib *)&(pHVar2->super_Directory).name,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_28._M_len,rhs);
      if (bVar3) break;
    }
  }
  return puVar5 != puVar1;
}

Assistant:

bool Jupiter::HTTP::Server::Data::has(std::string_view hostname) {
	unsigned int name_checksum = calc_checksumi(hostname);
	for (const auto& host : m_hosts) {
		if (name_checksum == host->name_checksum && jessilib::equalsi(host->name, hostname)) {
			return true;
		}
	}

	return false;
}